

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

void gguf_set_tensor_type(gguf_context *ctx,char *name,ggml_type type)

{
  pointer pgVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  int64_t iVar5;
  long lVar6;
  char *fmt;
  int line;
  long lVar7;
  
  uVar3 = gguf_find_tensor(ctx,name);
  if ((long)uVar3 < 0) {
    fmt = "tensor not found: %s";
    line = 0x456;
  }
  else {
    pgVar1 = (ctx->info).super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = uVar3 * 0x158;
    sVar4 = ggml_type_size(type);
    iVar5 = ggml_blck_size(type);
    pgVar1[uVar3].t.type = type;
    lVar6 = pgVar1[uVar3].t.ne[0];
    if (lVar6 % iVar5 == 0) {
      pgVar1[uVar3].t.nb[0] = sVar4;
      pgVar1[uVar3].t.nb[1] = (lVar6 / iVar5) * sVar4;
      sVar4 = pgVar1[uVar3].t.nb[1];
      lVar6 = 0;
      do {
        sVar4 = sVar4 * pgVar1[uVar3].t.ne[lVar6 + 1];
        pgVar1[uVar3].t.nb[lVar6 + 2] = sVar4;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      lVar6 = ((long)(ctx->info).
                     super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(ctx->info).
                     super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d;
      if ((long)(uVar3 + 1) < lVar6) {
        lVar6 = ~uVar3 + lVar6;
        do {
          pgVar1 = (ctx->info).
                   super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar2 = *(long *)((long)&pgVar1->offset + lVar7);
          sVar4 = ggml_nbytes((ggml_tensor *)((long)(pgVar1->t).ne + lVar7 + -0x10));
          *(size_t *)
           ((long)&(ctx->info).
                   super__Vector_base<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>._M_impl.
                   super__Vector_impl_data._M_start[1].offset + lVar7) =
               (-ctx->alignment & (sVar4 + ctx->alignment) - 1) + lVar2;
          lVar7 = lVar7 + 0x158;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      return;
    }
    fmt = "GGML_ASSERT(%s) failed";
    name = 
    "tensor->ne[0] % blck_size == 0 && \"tensor row size not divisible by block size of new type\"";
    line = 0x45d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,fmt,name);
}

Assistant:

void gguf_set_tensor_type(struct gguf_context * ctx, const char * name, enum ggml_type type) {
    const int64_t tensor_id = gguf_find_tensor(ctx, name);
    if (tensor_id < 0) {
        GGML_ABORT("tensor not found: %s", name);
    }
    struct ggml_tensor * tensor = &ctx->info[tensor_id].t;
    const size_t  type_size = ggml_type_size(type);
    const int64_t blck_size = ggml_blck_size(type);

    tensor->type = type;
    GGML_ASSERT(tensor->ne[0] % blck_size == 0 && "tensor row size not divisible by block size of new type");

    tensor->nb[0] = type_size;
    tensor->nb[1] = tensor->nb[0]*(tensor->ne[0]/blck_size);
    for (int i = 2; i < GGML_MAX_DIMS; i++) {
        tensor->nb[i] = tensor->nb[i - 1]*tensor->ne[i - 1];
    }

    // update offsets
    const int64_t n_tensors = gguf_get_n_tensors(ctx);
    for (int64_t i = tensor_id + 1; i < n_tensors; ++i) {
        ctx->info[i].offset = ctx->info[i - 1].offset + GGML_PAD(ggml_nbytes(&ctx->info[i - 1].t), ctx->alignment);
    }
}